

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_2_5::copyFromFrameBuffer
               (char **writePtr,char **readPtr,char *endPtr,size_t xStride,Format format,
               PixelType type)

{
  ArgExc *pAVar1;
  long in_RCX;
  undefined2 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  size_t i_1;
  size_t i;
  char *localReadPtr;
  char *localWritePtr;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  char **in_stack_ffffffffffffff90;
  ulong local_50;
  ulong local_48;
  undefined2 *local_38;
  undefined2 *local_30;
  
  local_30 = (undefined2 *)*in_RDI;
  local_38 = (undefined2 *)*in_RSI;
  if (in_R8D == 1) {
    if (in_R9D == 0) {
      for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
        Xdr::write<Imf_2_5::CharPtrIO,char*>
                  (in_stack_ffffffffffffff90,(uint)in_stack_ffffffffffffff8c);
      }
    }
    else if (in_R9D == 1) {
      for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
        Xdr::write<Imf_2_5::CharPtrIO,char*>
                  ((char **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (half)(unsigned_short)((ulong)in_stack_ffffffffffffff90 >> 0x30));
      }
    }
    else {
      if (in_R9D != 2) {
        pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
        __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
        Xdr::write<Imf_2_5::CharPtrIO,char*>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
    }
  }
  else if (in_R9D == 0) {
    for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
      for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
        *(undefined1 *)local_30 = *(undefined1 *)((long)local_38 + local_48);
        local_30 = (undefined2 *)((long)local_30 + 1);
      }
    }
  }
  else if (in_R9D == 1) {
    for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
      *local_30 = *local_38;
      local_30 = local_30 + 1;
    }
  }
  else {
    if (in_R9D != 2) {
      pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
      __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
      for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
        *(undefined1 *)local_30 = *(undefined1 *)((long)local_38 + local_50);
        local_30 = (undefined2 *)((long)local_30 + 1);
      }
    }
  }
  *in_RDI = local_30;
  *in_RSI = local_38;
  return;
}

Assistant:

void
copyFromFrameBuffer (char *& writePtr,
		     const char *& readPtr,
                     const char * endPtr,
		     size_t xStride,
                     Compressor::Format format,
		     PixelType type)
{
    char * localWritePtr = writePtr;
    const char * localReadPtr = readPtr;
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr,
                                        *(const unsigned int *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr, *(const half *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr, *(const float *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            while (localReadPtr <= endPtr)
            {
                for (size_t i = 0; i < sizeof (unsigned int); ++i)
                    *localWritePtr++ = localReadPtr[i];

                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            while (localReadPtr <= endPtr)
            {
                *(half *) localWritePtr = *(const half *) localReadPtr;
                localWritePtr += sizeof (half);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            while (localReadPtr <= endPtr)
            {
                for (size_t i = 0; i < sizeof (float); ++i)
                    *localWritePtr++ = localReadPtr[i];

                localReadPtr += xStride;
            }
            break;
            
          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }

    writePtr = localWritePtr;
    readPtr = localReadPtr;
}